

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

bool __thiscall asl::HttpMessage::hasHeader(HttpMessage *this,String *name)

{
  bool bVar1;
  String local_30;
  String *local_18;
  String *name_local;
  HttpMessage *this_local;
  
  local_18 = name;
  name_local = &this->_command;
  capitalized(&local_30,name);
  bVar1 = Map<asl::String,_asl::String>::has
                    (&(this->_headers).super_Map<asl::String,_asl::String>,&local_30);
  asl::String::~String(&local_30);
  return bVar1;
}

Assistant:

bool HttpMessage::hasHeader(const String& name) const
{
	return _headers.has(capitalized(name));
}